

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_writer.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::ZipWriter::Write(ZipWriter *this,string *filename,string *contents)

{
  size_type sVar1;
  uint uVar2;
  size_type sVar3;
  CodedOutputStream output;
  FileInfo info;
  
  info.name._M_dataplus._M_p = (pointer)&info.name.field_2;
  info.name._M_string_length = 0;
  info.name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&info);
  sVar1 = filename->_M_string_length;
  info.offset = (*this->raw_output_->_vptr_ZeroCopyOutputStream[4])();
  info.size = (uint32)contents->_M_string_length;
  uVar2 = 0xffffffff;
  for (sVar3 = 0; contents->_M_string_length != sVar3; sVar3 = sVar3 + 1) {
    uVar2 = uVar2 >> 8 ^
            *(uint *)(kCRC32Table +
                     (ulong)(byte)((contents->_M_dataplus)._M_p[sVar3] ^ (byte)uVar2) * 4);
  }
  info.crc32 = ~uVar2;
  std::
  vector<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
  ::push_back(&this->files_,&info);
  io::CodedOutputStream::CodedOutputStream(&output,this->raw_output_);
  io::CodedOutputStream::WriteLittleEndian32(&output,0x4034b50);
  WriteShort(&output,10);
  WriteShort(&output,0);
  WriteShort(&output,0);
  WriteShort(&output,0);
  WriteShort(&output,0);
  io::CodedOutputStream::WriteLittleEndian32(&output,info.crc32);
  io::CodedOutputStream::WriteLittleEndian32(&output,info.size);
  io::CodedOutputStream::WriteLittleEndian32(&output,info.size);
  WriteShort(&output,(uint16)sVar1);
  WriteShort(&output,0);
  io::CodedOutputStream::WriteString(&output,filename);
  io::CodedOutputStream::WriteString(&output,contents);
  io::CodedOutputStream::~CodedOutputStream(&output);
  std::__cxx11::string::~string((string *)&info);
  return (bool)(output.had_error_ ^ 1);
}

Assistant:

bool ZipWriter::Write(const string& filename, const string& contents) {
  FileInfo info;

  info.name = filename;
  uint16 filename_size = filename.size();
  info.offset = raw_output_->ByteCount();
  info.size = contents.size();
  info.crc32 = ComputeCRC32(contents);

  files_.push_back(info);

  // write file header
  io::CodedOutputStream output(raw_output_);
  output.WriteLittleEndian32(0x04034b50);  // magic
  WriteShort(&output, 10);  // version needed to extract
  WriteShort(&output, 0);  // flags
  WriteShort(&output, 0);  // compression method: stored
  WriteShort(&output, 0);  // last modified time
  WriteShort(&output, 0);  // last modified date
  output.WriteLittleEndian32(info.crc32);  // crc-32
  output.WriteLittleEndian32(info.size);  // compressed size
  output.WriteLittleEndian32(info.size);  // uncompressed size
  WriteShort(&output, filename_size);  // file name length
  WriteShort(&output, 0);   // extra field length
  output.WriteString(filename);  // file name
  output.WriteString(contents);  // file data

  return !output.HadError();
}